

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void registerInput(char *arg)

{
  FILE *__stream;
  bool bVar1;
  path *this;
  value_type *pvVar2;
  char *local_10;
  char *arg_local;
  
  local_10 = arg;
  bVar1 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.input);
  __stream = _stderr;
  if (bVar1) {
    this = std::optional<std::filesystem::__cxx11::path>::operator->(&options.input);
    pvVar2 = std::filesystem::__cxx11::path::c_str(this);
    fprintf(__stream,"FATAL: input image specified more than once! (first \"%s\", then \"%s\")\n",
            pvVar2,local_10);
    printUsage();
    exit(1);
  }
  if (*local_10 == '\0') {
    fprintf(_stderr,"FATAL: input image path cannot be empty\n");
    printUsage();
    exit(1);
  }
  std::optional<std::filesystem::__cxx11::path>::emplace<char_const*&>(&options.input,&local_10);
  return;
}

Assistant:

static void registerInput(char const *arg) {
	if (options.input.has_value()) {
		fprintf(stderr,
		        "FATAL: input image specified more than once! (first \"%s\", then "
		        "\"%s\")\n",
		        options.input->c_str(), arg);
		printUsage();
		exit(1);
	} else if (arg[0] == '\0') { // Empty input path
		fprintf(stderr, "FATAL: input image path cannot be empty\n");
		printUsage();
		exit(1);
	} else {
		options.input.emplace(arg);
	}
}